

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O0

void os_interface_linux_trigger_handler(os_interface_listener *if_listener)

{
  os_interface_listener *if_listener_local;
  
  if_listener->_dirty = true;
  if ((if_listener->data->_change_timer)._clock == 0) {
    oonf_timer_start_ext(&if_listener->data->_change_timer,200,200);
  }
  return;
}

Assistant:

void
os_interface_linux_trigger_handler(struct os_interface_listener *if_listener) {
  if_listener->_dirty = true;
  if (!oonf_timer_is_active(&if_listener->data->_change_timer)) {
    oonf_timer_start(&if_listener->data->_change_timer, OS_INTERFACE_CHANGE_TRIGGER_INTERVAL);
  }
}